

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O3

iterator * __thiscall
google::
dense_hashtable<char_const*,char_const*,std::hash<char_const*>,google::dense_hash_set<char_const*,std::hash<char_const*>,std::equal_to<char_const*>,google::libc_allocator_with_realloc<char_const*>>::Identity,google::dense_hash_set<char_const*,std::hash<char_const*>,std::equal_to<char_const*>,google::libc_allocator_with_realloc<char_const*>>::SetKey,std::equal_to<char_const*>,google::libc_allocator_with_realloc<char_const*>>
::insert_at<char_const*const&>
          (iterator *__return_storage_ptr__,
          dense_hashtable<char_const*,char_const*,std::hash<char_const*>,google::dense_hash_set<char_const*,std::hash<char_const*>,std::equal_to<char_const*>,google::libc_allocator_with_realloc<char_const*>>::Identity,google::dense_hash_set<char_const*,std::hash<char_const*>,std::equal_to<char_const*>,google::libc_allocator_with_realloc<char_const*>>::SetKey,std::equal_to<char_const*>,google::libc_allocator_with_realloc<char_const*>>
          *this,size_type pos,char **args)

{
  long lVar1;
  long lVar2;
  length_error *this_00;
  
  lVar1 = *(long *)(this + 0x30);
  if ((ulong)(*(long *)(this + 0x38) - lVar1) < 0x1fffffffffffffff) {
    if ((lVar1 == 0) || (*(long *)(this + 0x20) != *(long *)(*(long *)(this + 0x50) + pos * 8))) {
      *(long *)(this + 0x38) = *(long *)(this + 0x38) + 1;
    }
    else {
      *(long *)(this + 0x30) = lVar1 + -1;
    }
    *(char **)(*(long *)(this + 0x50) + pos * 8) = *args;
    lVar1 = *(long *)(this + 0x40);
    lVar2 = *(long *)(this + 0x50);
    __return_storage_ptr__->ht =
         (dense_hashtable<const_char_*,_const_char_*,_std::hash<const_char_*>,_google::dense_hash_set<const_char_*,_std::hash<const_char_*>,_std::equal_to<const_char_*>,_google::libc_allocator_with_realloc<const_char_*>_>::Identity,_google::dense_hash_set<const_char_*,_std::hash<const_char_*>,_std::equal_to<const_char_*>,_google::libc_allocator_with_realloc<const_char_*>_>::SetKey,_std::equal_to<const_char_*>,_google::libc_allocator_with_realloc<const_char_*>_>
          *)this;
    __return_storage_ptr__->pos = (pointer)(lVar2 + pos * 8);
    __return_storage_ptr__->end = (pointer)(lVar2 + lVar1 * 8);
    return __return_storage_ptr__;
  }
  this_00 = (length_error *)__cxa_allocate_exception(0x10);
  std::length_error::length_error(this_00,"insert overflow");
  __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
}

Assistant:

size_type size() const { return num_elements - num_deleted; }